

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

void Clara::Detail::convertInto(string *_source,bool *_dest)

{
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __first;
  undefined1 uVar1;
  undefined1 uVar2;
  undefined1 uVar3;
  undefined1 uVar4;
  undefined1 uVar5;
  undefined1 uVar6;
  undefined1 uVar7;
  undefined1 uVar8;
  runtime_error *this;
  undefined1 *in_RSI;
  string *in_RDI;
  string sourceLC;
  char *in_stack_ffffffffffffff38;
  undefined1 in_stack_ffffffffffffff40;
  undefined1 in_stack_ffffffffffffff41;
  undefined1 in_stack_ffffffffffffff42;
  undefined1 in_stack_ffffffffffffff43;
  undefined1 in_stack_ffffffffffffff44;
  undefined1 in_stack_ffffffffffffff45;
  undefined1 in_stack_ffffffffffffff46;
  undefined1 in_stack_ffffffffffffff47;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __result;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  in_stack_ffffffffffffff50;
  undefined7 in_stack_ffffffffffffff58;
  undefined1 in_stack_ffffffffffffff5f;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff80;
  char *in_stack_ffffffffffffff88;
  string local_30 [32];
  undefined1 *local_10;
  
  __result._M_current = (char *)local_30;
  local_10 = in_RSI;
  std::__cxx11::string::string((string *)__result._M_current,in_RDI);
  std::__cxx11::string::begin();
  std::__cxx11::string::end();
  std::__cxx11::string::begin();
  __first._M_current._7_1_ = in_stack_ffffffffffffff5f;
  __first._M_current._0_7_ = in_stack_ffffffffffffff58;
  std::
  transform<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,int(*)(int)>
            (__first,in_stack_ffffffffffffff50,__result,
             (_func_int_int *)
             CONCAT17(in_stack_ffffffffffffff47,
                      CONCAT16(in_stack_ffffffffffffff46,
                               CONCAT15(in_stack_ffffffffffffff45,
                                        CONCAT14(in_stack_ffffffffffffff44,
                                                 CONCAT13(in_stack_ffffffffffffff43,
                                                          CONCAT12(in_stack_ffffffffffffff42,
                                                                   CONCAT11(
                                                  in_stack_ffffffffffffff41,
                                                  in_stack_ffffffffffffff40))))))));
  uVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          CONCAT17(in_stack_ffffffffffffff47,
                                   CONCAT16(in_stack_ffffffffffffff46,
                                            CONCAT15(in_stack_ffffffffffffff45,
                                                     CONCAT14(in_stack_ffffffffffffff44,
                                                              CONCAT13(in_stack_ffffffffffffff43,
                                                                       CONCAT12(
                                                  in_stack_ffffffffffffff42,
                                                  CONCAT11(in_stack_ffffffffffffff41,
                                                           in_stack_ffffffffffffff40))))))),
                          in_stack_ffffffffffffff38);
  if (!(bool)uVar1) {
    uVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            CONCAT17(uVar1,CONCAT16(in_stack_ffffffffffffff46,
                                                    CONCAT15(in_stack_ffffffffffffff45,
                                                             CONCAT14(in_stack_ffffffffffffff44,
                                                                      CONCAT13(
                                                  in_stack_ffffffffffffff43,
                                                  CONCAT12(in_stack_ffffffffffffff42,
                                                           CONCAT11(in_stack_ffffffffffffff41,
                                                                    in_stack_ffffffffffffff40)))))))
                            ,in_stack_ffffffffffffff38);
    if (!(bool)uVar2) {
      uVar3 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              CONCAT17(uVar1,CONCAT16(uVar2,CONCAT15(in_stack_ffffffffffffff45,
                                                                     CONCAT14(
                                                  in_stack_ffffffffffffff44,
                                                  CONCAT13(in_stack_ffffffffffffff43,
                                                           CONCAT12(in_stack_ffffffffffffff42,
                                                                    CONCAT11(
                                                  in_stack_ffffffffffffff41,
                                                  in_stack_ffffffffffffff40))))))),
                              in_stack_ffffffffffffff38);
      if (!(bool)uVar3) {
        uVar4 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )CONCAT17(uVar1,CONCAT16(uVar2,CONCAT15(uVar3,CONCAT14(
                                                  in_stack_ffffffffffffff44,
                                                  CONCAT13(in_stack_ffffffffffffff43,
                                                           CONCAT12(in_stack_ffffffffffffff42,
                                                                    CONCAT11(
                                                  in_stack_ffffffffffffff41,
                                                  in_stack_ffffffffffffff40))))))),
                                in_stack_ffffffffffffff38);
        if (!(bool)uVar4) {
          uVar5 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)CONCAT17(uVar1,CONCAT16(uVar2,CONCAT15(uVar3,CONCAT14(uVar4,
                                                  CONCAT13(in_stack_ffffffffffffff43,
                                                           CONCAT12(in_stack_ffffffffffffff42,
                                                                    CONCAT11(
                                                  in_stack_ffffffffffffff41,
                                                  in_stack_ffffffffffffff40))))))),
                                  in_stack_ffffffffffffff38);
          if (!(bool)uVar5) {
            uVar6 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)CONCAT17(uVar1,CONCAT16(uVar2,CONCAT15(uVar3,CONCAT14(uVar4,
                                                  CONCAT13(uVar5,CONCAT12(in_stack_ffffffffffffff42,
                                                                          CONCAT11(
                                                  in_stack_ffffffffffffff41,
                                                  in_stack_ffffffffffffff40))))))),
                                    in_stack_ffffffffffffff38);
            if (!(bool)uVar6) {
              uVar7 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                       *)CONCAT17(uVar1,CONCAT16(uVar2,CONCAT15(uVar3,CONCAT14(uVar4
                                                  ,CONCAT13(uVar5,CONCAT12(uVar6,CONCAT11(
                                                  in_stack_ffffffffffffff41,
                                                  in_stack_ffffffffffffff40))))))),
                                      in_stack_ffffffffffffff38);
              if (!(bool)uVar7) {
                uVar8 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                         *)CONCAT17(uVar1,CONCAT16(uVar2,CONCAT15(uVar3,CONCAT14(
                                                  uVar4,CONCAT13(uVar5,CONCAT12(uVar6,CONCAT11(uVar7
                                                  ,in_stack_ffffffffffffff40))))))),
                                        in_stack_ffffffffffffff38);
                if (!(bool)uVar8) {
                  this = (runtime_error *)__cxa_allocate_exception(0x10);
                  std::operator+(in_stack_ffffffffffffff88,in_stack_ffffffffffffff80);
                  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)__result._M_current,
                                 (char *)CONCAT17(uVar1,CONCAT16(uVar2,CONCAT15(uVar3,CONCAT14(uVar4
                                                  ,CONCAT13(uVar5,CONCAT12(uVar6,CONCAT11(uVar7,
                                                  uVar8))))))));
                  std::runtime_error::runtime_error(this,(string *)&stack0xffffffffffffff80);
                  __cxa_throw(this,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error)
                  ;
                }
              }
            }
          }
          *local_10 = 0;
          goto LAB_001b7ebe;
        }
      }
    }
  }
  *local_10 = 1;
LAB_001b7ebe:
  std::__cxx11::string::~string(local_30);
  return;
}

Assistant:

inline void convertInto( std::string const& _source, bool& _dest ) {
            std::string sourceLC = _source;
            std::transform( sourceLC.begin(), sourceLC.end(), sourceLC.begin(), ::tolower );
            if( sourceLC == "1" || sourceLC == "true" || sourceLC == "yes" || sourceLC == "on" )
                _dest = true;
            else if( sourceLC == "0" || sourceLC == "false" || sourceLC == "no" || sourceLC == "off" )
                _dest = false;
            else
                throw std::runtime_error( "Expected a boolean value but did recognise: '" + _source + "'" );
        }